

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrologEncoderMD.cpp
# Opt level: O0

uchar PrologEncoderMD::GetXmmRegToSave(Instr *instr,unsigned_short *scaledOffset)

{
  code *pcVar1;
  bool bVar2;
  RegNum RVar3;
  RegNum RVar4;
  RegNum RVar5;
  int32 iVar6;
  int32 iVar7;
  int32 iVar8;
  uint size;
  uint uVar9;
  undefined4 *puVar10;
  Opnd *pOVar11;
  RegOpnd *pRVar12;
  IndirOpnd *pIVar13;
  Func *this;
  Func *topFunc;
  uint offsetFromInstr;
  uchar reg;
  unsigned_short *scaledOffset_local;
  Instr *instr_local;
  
  if (scaledOffset == (unsigned_short *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x46,"(scaledOffset)","scaledOffset");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if ((instr->m_opcode != MOVAPD) && (instr->m_opcode != MOVAPS)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x47,
                       "(instr->m_opcode == Js::OpCode::MOVAPD || instr->m_opcode == Js::OpCode::MOVAPS)"
                       ,
                       "instr->m_opcode == Js::OpCode::MOVAPD || instr->m_opcode == Js::OpCode::MOVAPS"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pOVar11 = IR::Instr::GetDst(instr);
  if (pOVar11 != (Opnd *)0x0) {
    pOVar11 = IR::Instr::GetDst(instr);
    bVar2 = IR::Opnd::IsIndirOpnd(pOVar11);
    if (bVar2) goto LAB_0087cccc;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar10 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                     ,0x48,"(instr->GetDst() && instr->GetDst()->IsIndirOpnd())",
                     "instr->GetDst() && instr->GetDst()->IsIndirOpnd()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar10 = 0;
LAB_0087cccc:
  pOVar11 = IR::Instr::GetSrc1(instr);
  pRVar12 = IR::Opnd::AsRegOpnd(pOVar11);
  RVar3 = IR::RegOpnd::GetReg(pRVar12);
  pOVar11 = IR::Instr::GetDst(instr);
  pIVar13 = IR::Opnd::AsIndirOpnd(pOVar11);
  iVar6 = IR::IndirOpnd::GetOffset(pIVar13);
  pOVar11 = IR::Instr::GetDst(instr);
  pIVar13 = IR::Opnd::AsIndirOpnd(pOVar11);
  pRVar12 = IR::IndirOpnd::GetBaseOpnd(pIVar13);
  RVar4 = IR::RegOpnd::GetReg(pRVar12);
  RVar5 = LowererMDArch::GetRegStackPointer();
  if (RVar4 != RVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x50,
                       "(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetReg() == LowererMDArch::GetRegStackPointer())"
                       ,
                       "instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetReg() == LowererMDArch::GetRegStackPointer()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  this = Func::GetTopFunc(instr->m_func);
  iVar7 = Func::GetArgsSize(this);
  iVar8 = Func::GetSavedRegSize(this);
  size = iVar7 + iVar8 + iVar6;
  if ((int)size < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x55,"(static_cast<int32>(offsetFromInstr) >= 0)",
                       "static_cast<int32>(offsetFromInstr) >= 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  uVar9 = Math::Align<unsigned_int>(size,0x10);
  if (uVar9 != size) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x56,
                       "(::Math::Align(offsetFromInstr, static_cast<unsigned int>(MachDouble * 2)) == offsetFromInstr)"
                       ,
                       "::Math::Align(offsetFromInstr, static_cast<unsigned __int32>(MachDouble * 2)) == offsetFromInstr"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if ((size >> 4 & 0xffff0000) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x5d,"((!(((size_t)offsetFromInstr) & ~((size_t)0xFFFF))))",
                       "IS_UINT16(offsetFromInstr)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  *scaledOffset = (unsigned_short)(size >> 4);
  return RVar3 - RegXMM0;
}

Assistant:

unsigned __int8 PrologEncoderMD::GetXmmRegToSave(IR::Instr *instr, unsigned __int16 *scaledOffset)
{
    Assert(scaledOffset);
    Assert(instr->m_opcode == Js::OpCode::MOVAPD || instr->m_opcode == Js::OpCode::MOVAPS);
    Assert(instr->GetDst() && instr->GetDst()->IsIndirOpnd());

    unsigned __int8 reg = ((instr->GetSrc1()->AsRegOpnd()->GetReg() - FIRST_XMM_REG) & 0xFF);
    unsigned __int32 offsetFromInstr = instr->GetDst()->AsIndirOpnd()->GetOffset();

    // The offset in the instruction is relative to the stack pointer before the saved reg size and stack args size were
    // subtracted, but the offset in the unwind info needs to be relative to the final stack pointer value
    // (see LowererMDArch::LowerEntryInstr), so adjust for that
    Assert(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetReg() == LowererMDArch::GetRegStackPointer());
    Func *const topFunc = instr->m_func->GetTopFunc();
    offsetFromInstr += topFunc->GetArgsSize() + topFunc->GetSavedRegSize();

    // Can only encode nonnegative 16-byte-aligned offsets in the unwind info
    Assert(static_cast<int32>(offsetFromInstr) >= 0);
    Assert(::Math::Align(offsetFromInstr, static_cast<unsigned __int32>(MachDouble * 2)) == offsetFromInstr);

    // Stored offset is scaled by 16
    offsetFromInstr /= MachDouble * 2;

    // We currently don't allow a total stack size greater than 1 MB. If we start allowing that, we will need to handle offsets
    // greater than (1 MB - 16) in the unwind info as well, for which a FAR version of the op-code is necessary.
    Assert(IS_UINT16(offsetFromInstr));

    *scaledOffset = TO_UINT16(offsetFromInstr);

    return reg;
}